

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

void anon_unknown.dwarf_67f0f0::crypto_polyval_update_blocks
               (polyval_ctx *ctx,uint8_t *in,size_t in_len)

{
  ulong local_238;
  size_t i;
  size_t blocks;
  size_t todo;
  uint8_t buf [512];
  size_t in_len_local;
  uint8_t *in_local;
  polyval_ctx *ctx_local;
  
  buf._504_8_ = in_len;
  in_len_local = (size_t)in;
  if ((in_len & 0xf) != 0) {
    __assert_fail("(in_len & 15) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                  ,0x29f,
                  "void (anonymous namespace)::crypto_polyval_update_blocks(struct polyval_ctx *, const uint8_t *, size_t)"
                 );
  }
  while (buf._504_8_ != 0) {
    blocks._0_1_ = buf[0x1f8];
    blocks._1_1_ = buf[0x1f9];
    blocks._2_1_ = buf[0x1fa];
    blocks._3_1_ = buf[0x1fb];
    blocks._4_1_ = buf[0x1fc];
    blocks._5_1_ = buf[0x1fd];
    blocks._6_1_ = buf[0x1fe];
    blocks._7_1_ = buf[0x1ff];
    if (0x200 < (ulong)buf._504_8_) {
      blocks = 0x200;
    }
    ::OPENSSL_memcpy(&todo,(void *)in_len_local,blocks);
    in_len_local = blocks + in_len_local;
    buf._504_8_ = buf._504_8_ - blocks;
    for (local_238 = 0; local_238 < blocks >> 4; local_238 = local_238 + 1) {
      byte_reverse(buf + local_238 * 0x10 + -8);
    }
    (*ctx->ghash)(ctx->S,ctx->Htable,(uint8_t *)&todo,blocks);
  }
  return;
}

Assistant:

void crypto_polyval_update_blocks(struct polyval_ctx *ctx, const uint8_t *in,
                                  size_t in_len) {
  assert((in_len & 15) == 0);
  alignas(8) uint8_t buf[32 * 16];

  while (in_len > 0) {
    size_t todo = in_len;
    if (todo > sizeof(buf)) {
      todo = sizeof(buf);
    }
    OPENSSL_memcpy(buf, in, todo);
    in += todo;
    in_len -= todo;

    size_t blocks = todo / 16;
    for (size_t i = 0; i < blocks; i++) {
      byte_reverse(buf + 16 * i);
    }

    ctx->ghash(ctx->S, ctx->Htable, buf, todo);
  }
}